

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::TcpSocketEngine::Connect
          (TcpSocketEngine *this,HostAddress *address,uint16_t port)

{
  bool bVar1;
  
  bVar1 = false;
  if ((this->m_socketDescriptor != -1) && (this->m_socketState != ConnectedState)) {
    bVar1 = nativeConnect(this,address,port);
    if (bVar1) {
      HostAddress::operator=(&this->m_remoteAddress,address);
      this->m_remotePort = port;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool TcpSocketEngine::Connect(const HostAddress& address, const uint16_t port)
{

    // return failure if invalid FD or already connected
    if (!IsValid() || (m_socketState == TcpSocket::ConnectedState)) {
        // TODO: set error string
        return false;
    }

    // attempt to connect to host address on requested port
    if (!nativeConnect(address, port)) {
        // TODO: set error string
        return false;
    }

    // if successful, store remote host address port & return success
    // TODO: (later) fetch proxied remote & local host/port  here
    m_remoteAddress = address;
    m_remotePort = port;
    return true;
}